

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O2

Aig_Man_t * Saig_ManDupFoldConstrsFunc2(Aig_Man_t *pAig,int fCompl,int fVerbose,int typeII_cnt)

{
  bool bVar1;
  bool bVar2;
  Aig_Man_t *pAVar3;
  char *pcVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  Aig_Obj_t *local_40;
  
  if (pAig->nConstrs == 0) {
    pAVar3 = Aig_ManDupDfs(pAig);
    return pAVar3;
  }
  if (pAig->nTruePos <= pAig->nConstrs) {
    __assert_fail("Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigUnfold2.c"
                  ,0x17f,"Aig_Man_t *Saig_ManDupFoldConstrsFunc2(Aig_Man_t *, int, int, int)");
  }
  pAVar3 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  pcVar4 = Abc_UtilStrsav(pAig->pName);
  pAVar3->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pAig->pSpec);
  pAVar3->pSpec = pcVar4;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar3->pConst1;
  for (iVar11 = 0; iVar11 < pAig->vCis->nSize; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCis,iVar11);
    pAVar6 = Aig_ObjCreateCi(pAVar3);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
  }
  for (iVar11 = 0; iVar11 < pAig->vObjs->nSize; iVar11 = iVar11 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar11);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7)) {
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      pAVar8 = Aig_ObjChild1Copy(pAVar6);
      pAVar7 = Aig_And(pAVar3,pAVar7,pAVar8);
      (pAVar6->field_5).pData = pAVar7;
    }
  }
  local_40 = (Aig_Obj_t *)((ulong)pAVar3->pConst1 ^ 1);
  uVar9 = (ulong)fCompl;
  bVar1 = false;
  for (uVar10 = 0; (int)uVar10 < pAig->nTruePos; uVar10 = uVar10 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,uVar10);
    if (pAig->nTruePos - pAig->nConstrs <= (int)uVar10) {
      if (pAig->nTruePos <= (int)uVar10 || bVar1) {
        pAVar7 = Aig_ObjCreateCi(pAVar3);
        pAVar8 = Aig_ObjChild0Copy(pAVar6);
        pAVar7 = Aig_And(pAVar3,(Aig_Obj_t *)((ulong)pAVar7 ^ uVar9),
                         (Aig_Obj_t *)((ulong)pAVar8 ^ uVar9));
        local_40 = Aig_Or(pAVar3,local_40,pAVar7);
        pcVar4 = "!";
        if (((ulong)pAVar6 & 1) == 0) {
          pcVar4 = "";
        }
        printf("modeling typeII : %d:%s%d \n",(ulong)uVar10,pcVar4,
               (ulong)*(uint *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24));
        bVar1 = true;
      }
      else {
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        local_40 = Aig_Or(pAVar3,local_40,(Aig_Obj_t *)((ulong)pAVar6 ^ uVar9));
        bVar1 = false;
      }
    }
  }
  if (0 < pAig->nRegs) {
    pAVar6 = Aig_ObjCreateCi(pAVar3);
    local_40 = Aig_Or(pAVar3,local_40,pAVar6);
  }
  for (iVar11 = 0; iVar11 < pAig->nTruePos; iVar11 = iVar11 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar11);
    if (iVar11 < pAig->nTruePos - pAig->nConstrs) {
      pAVar6 = Aig_ObjChild0Copy(pAVar6);
      pAVar6 = Aig_And(pAVar3,pAVar6,(Aig_Obj_t *)((ulong)local_40 ^ 1));
      Aig_ObjCreateCo(pAVar3,pAVar6);
    }
  }
  for (uVar10 = 0; (int)uVar10 < pAig->nRegs; uVar10 = uVar10 + 1) {
    pAVar6 = Saig_ManLi(pAig,uVar10);
    pAVar7 = Saig_ManLo(pAig,uVar10);
    if ((int)uVar10 < pAig->nRegs) {
      pAVar6 = Aig_ObjChild0Copy(pAVar6);
      pAVar6 = Aig_Mux(pAVar3,(Aig_Obj_t *)((ulong)local_40 ^ 1),pAVar6,
                       (Aig_Obj_t *)(pAVar7->field_5).pData);
    }
    else {
      printf("skipping: reg%d\n",(ulong)uVar10);
      pAVar6 = Aig_ObjChild0Copy(pAVar6);
    }
    Aig_ObjCreateCo(pAVar3,pAVar6);
  }
  Aig_ManSetRegNum(pAVar3,pAig->nRegs);
  bVar1 = false;
  for (uVar10 = 0; (int)uVar10 < pAig->nTruePos; uVar10 = uVar10 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,uVar10);
    if ((pAig->nTruePos - pAig->nConstrs <= (int)uVar10) &&
       (bVar2 = pAig->nTruePos <= (int)uVar10 || bVar1, bVar1 = false, bVar2)) {
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      Aig_ObjCreateCo(pAVar3,pAVar7);
      Aig_ManSetRegNum(pAVar3,pAVar3->nRegs + 1);
      pcVar4 = "!";
      if (((ulong)pAVar6 & 1) == 0) {
        pcVar4 = "";
      }
      printf("Latch for typeII : %d:%s%d \n",(ulong)uVar10,pcVar4,
             (ulong)*(uint *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24));
      bVar1 = true;
    }
  }
  if (0 < pAig->nRegs) {
    Aig_ObjCreateCo(pAVar3,local_40);
    Aig_ManSetRegNum(pAVar3,pAVar3->nRegs + 1);
  }
  printf("#reg after fold2: %d\n",(ulong)(uint)pAVar3->nRegs);
  Aig_ManCleanup(pAVar3);
  Aig_ManSeqCleanup(pAVar3);
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManDupFoldConstrsFunc2( Aig_Man_t * pAig, int fCompl, int fVerbose , 
                                         int typeII_cnt)
{
  Aig_Man_t * pAigNew;
  Aig_Obj_t * pMiter, * pFlopOut, * pFlopIn, * pObj;
  int i, typeII_cc, type_II;
  if ( Aig_ManConstrNum(pAig) == 0 )
    return Aig_ManDupDfs( pAig );
  assert( Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig) );
  // start the new manager
  pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
  pAigNew->pName = Abc_UtilStrsav( pAig->pName );
  pAigNew->pSpec = Abc_UtilStrsav( pAig->pSpec );
  // map the constant node
  Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
  // create variables for PIs
  Aig_ManForEachCi( pAig, pObj, i )
    pObj->pData = Aig_ObjCreateCi( pAigNew );
  // add internal nodes of this frame
  Aig_ManForEachNode( pAig, pObj, i )
    pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

  // OR the constraint outputs
  pMiter = Aig_ManConst0( pAigNew );
  typeII_cc = 0;//typeII_cnt;
  typeII_cnt = 0;  
  type_II = 0;
    
  Saig_ManForEachPo( pAig, pObj, i )
    {
      
      if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      if (i + typeII_cnt >= Saig_ManPoNum(pAig) ) {
        type_II = 1;
      }
      /*  now we got the constraint */
      if (type_II) {

        Aig_Obj_t * type_II_latch
          = Aig_ObjCreateCi(pAigNew); /* will get connected later; */
        pMiter = Aig_Or(pAigNew, pMiter, 
                        Aig_And(pAigNew, 
                                Aig_NotCond(type_II_latch, fCompl),
                                Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) )
                        );
        printf( "modeling typeII : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
      } else 
        pMiter = Aig_Or( pAigNew, pMiter, Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) );
    }

  // create additional flop
  if ( Saig_ManRegNum(pAig) > 0 )
    {
      pFlopOut = Aig_ObjCreateCi( pAigNew );
      pFlopIn  = Aig_Or( pAigNew, pMiter, pFlopOut );
    }
  else 
    pFlopIn = pMiter;

  // create primary output
  Saig_ManForEachPo( pAig, pObj, i )
    {
      if ( i >= Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      pMiter = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_Not(pFlopIn) );
      Aig_ObjCreateCo( pAigNew, pMiter );
    }

  // transfer to register outputs
  {
    /* the same for type I and type II */
    Aig_Obj_t * pObjLi, *pObjLo;

    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )	{
      if( i + typeII_cc < Aig_ManRegNum(pAig)) {
        Aig_Obj_t *c = Aig_Mux(pAigNew, Aig_Not(pFlopIn), 
                               Aig_ObjChild0Copy(pObjLi) ,
                               (Aig_Obj_t*)pObjLo->pData);
        Aig_ObjCreateCo( pAigNew, c);
      } else {
        printf ( "skipping: reg%d\n", i);
        Aig_ObjCreateCo( pAigNew,Aig_ObjChild0Copy(pObjLi));
      }
    }

  }
  if(0)Saig_ManForEachLi( pAig, pObj, i ) {
      Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    }
  Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    
  type_II = 0;
  Saig_ManForEachPo( pAig, pObj, i )
    {
	
      if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
        continue;
      if (i + typeII_cnt >= Saig_ManPoNum(pAig) ) {
        type_II = 1;
      }
      /*  now we got the constraint */
      if (type_II) {
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj));
        Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAigNew)+1 );
        printf( "Latch for typeII : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
      }
    }

     
  // create additional flop 

  if ( Saig_ManRegNum(pAig) > 0 )
    {
      Aig_ObjCreateCo( pAigNew, pFlopIn );
      Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAigNew)+1 );
    }
  printf("#reg after fold2: %d\n", Aig_ManRegNum(pAigNew));
  // perform cleanup
  Aig_ManCleanup( pAigNew );
  Aig_ManSeqCleanup( pAigNew );
  return pAigNew;
}